

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

void __thiscall ON_HatchPattern::SetFillType(ON_HatchPattern *this,HatchFillType type)

{
  HatchFillType HVar1;
  
  if (this->m_type != type) {
    HVar1 = HatchFillTypeFromUnsigned(type);
    if (HVar1 == type) {
      if (type != Lines) {
        ON_ClassArray<ON_HatchLine>::Destroy(&this->m_lines);
      }
      this->m_type = type;
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
      return;
    }
  }
  return;
}

Assistant:

void ON_HatchPattern::SetFillType( ON_HatchPattern::HatchFillType type)
{
  if ( m_type != type && type == ON_HatchPattern::HatchFillTypeFromUnsigned(static_cast<unsigned int>(type)) )
  {
    if (ON_HatchPattern::HatchFillType::Lines != type)
      m_lines.Destroy();
    m_type = type;
    IncrementContentVersionNumber();
  }
}